

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack26_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3ffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x1a;
  out[1] = (uVar1 >> 0x1a) + base + (in[1] & 0xfffff) * 0x40;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x14;
  out[2] = (uVar1 >> 0x14) + base + (in[2] & 0x3fff) * 0x1000;
  uVar1 = in[2];
  out[3] = uVar1 >> 0xe;
  out[3] = (uVar1 >> 0xe) + base + (in[3] & 0xff) * 0x40000;
  uVar1 = in[3];
  out[4] = uVar1 >> 8;
  out[4] = (uVar1 >> 8) + base + (in[4] & 3) * 0x1000000;
  out[5] = (in[4] >> 2 & 0x3ffffff) + base;
  uVar1 = in[4];
  out[6] = uVar1 >> 0x1c;
  out[6] = (uVar1 >> 0x1c) + base + (in[5] & 0x3fffff) * 0x10;
  uVar1 = in[5];
  out[7] = uVar1 >> 0x16;
  out[7] = (uVar1 >> 0x16) + base + (in[6] & 0xffff) * 0x400;
  uVar1 = in[6];
  out[8] = uVar1 >> 0x10;
  out[8] = (uVar1 >> 0x10) + base + (in[7] & 0x3ff) * 0x10000;
  uVar1 = in[7];
  out[9] = uVar1 >> 10;
  out[9] = (uVar1 >> 10) + base + (in[8] & 0xf) * 0x400000;
  out[10] = (in[8] >> 4 & 0x3ffffff) + base;
  uVar1 = in[8];
  out[0xb] = uVar1 >> 0x1e;
  out[0xb] = (uVar1 >> 0x1e) + base + (in[9] & 0xffffff) * 4;
  uVar1 = in[9];
  out[0xc] = uVar1 >> 0x18;
  out[0xc] = (uVar1 >> 0x18) + base + (in[10] & 0x3ffff) * 0x100;
  uVar1 = in[10];
  out[0xd] = uVar1 >> 0x12;
  out[0xd] = (uVar1 >> 0x12) + base + (in[0xb] & 0xfff) * 0x4000;
  uVar1 = in[0xb];
  out[0xe] = uVar1 >> 0xc;
  out[0xe] = (uVar1 >> 0xc) + base + (in[0xc] & 0x3f) * 0x100000;
  out[0xf] = (in[0xc] >> 6) + base;
  out[0x10] = (in[0xd] & 0x3ffffff) + base;
  uVar1 = in[0xd];
  out[0x11] = uVar1 >> 0x1a;
  out[0x11] = (uVar1 >> 0x1a) + base + (in[0xe] & 0xfffff) * 0x40;
  uVar1 = in[0xe];
  out[0x12] = uVar1 >> 0x14;
  out[0x12] = (uVar1 >> 0x14) + base + (in[0xf] & 0x3fff) * 0x1000;
  uVar1 = in[0xf];
  out[0x13] = uVar1 >> 0xe;
  out[0x13] = (uVar1 >> 0xe) + base + (in[0x10] & 0xff) * 0x40000;
  uVar1 = in[0x10];
  out[0x14] = uVar1 >> 8;
  out[0x14] = (uVar1 >> 8) + base + (in[0x11] & 3) * 0x1000000;
  out[0x15] = (in[0x11] >> 2 & 0x3ffffff) + base;
  uVar1 = in[0x11];
  out[0x16] = uVar1 >> 0x1c;
  out[0x16] = (uVar1 >> 0x1c) + base + (in[0x12] & 0x3fffff) * 0x10;
  uVar1 = in[0x12];
  out[0x17] = uVar1 >> 0x16;
  out[0x17] = (uVar1 >> 0x16) + base + (in[0x13] & 0xffff) * 0x400;
  uVar1 = in[0x13];
  out[0x18] = uVar1 >> 0x10;
  out[0x18] = (uVar1 >> 0x10) + base + (in[0x14] & 0x3ff) * 0x10000;
  uVar1 = in[0x14];
  out[0x19] = uVar1 >> 10;
  out[0x19] = (uVar1 >> 10) + base + (in[0x15] & 0xf) * 0x400000;
  out[0x1a] = (in[0x15] >> 4 & 0x3ffffff) + base;
  uVar1 = in[0x15];
  out[0x1b] = uVar1 >> 0x1e;
  out[0x1b] = (uVar1 >> 0x1e) + base + (in[0x16] & 0xffffff) * 4;
  uVar1 = in[0x16];
  out[0x1c] = uVar1 >> 0x18;
  out[0x1c] = (uVar1 >> 0x18) + base + (in[0x17] & 0x3ffff) * 0x100;
  uVar1 = in[0x17];
  out[0x1d] = uVar1 >> 0x12;
  out[0x1d] = (uVar1 >> 0x12) + base + (in[0x18] & 0xfff) * 0x4000;
  uVar1 = in[0x18];
  out[0x1e] = uVar1 >> 0xc;
  out[0x1e] = (uVar1 >> 0xc) + base + (in[0x19] & 0x3f) * 0x100000;
  out[0x1f] = (in[0x19] >> 6) + base;
  return in + 0x1a;
}

Assistant:

uint32_t * unpack26_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 26 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 26 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 26 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 26 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 26 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 26 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 26 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 26 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 26 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 26 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 26 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 26 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 26 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 26 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 26 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 26 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 26 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 26 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 26 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 26 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 26 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 26 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 26 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 26 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 26 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 26 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 26 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 26 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 26 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 26 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}